

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas.cpp
# Opt level: O1

void NULLCCanvas::CanvasDrawLineAA(double x1,double y1,double x2,double y2,Canvas *ptr)

{
  double dVar1;
  uint uVar2;
  uint y;
  uint uVar3;
  uint uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  if (ptr == (Canvas *)0x0) {
    nullcThrowError("ERROR: Canvas object is nullptr");
    return;
  }
  dVar9 = x2 - x1;
  dVar8 = y2 - y1;
  dVar12 = -dVar9;
  if (-dVar9 <= dVar9) {
    dVar12 = dVar9;
  }
  dVar11 = -dVar8;
  if (-dVar8 <= dVar8) {
    dVar11 = dVar8;
  }
  dVar7 = x2;
  dVar10 = dVar8;
  dVar5 = x1;
  if (dVar12 < dVar11) {
    dVar7 = y2;
    dVar10 = dVar9;
    dVar9 = dVar8;
    dVar5 = y1;
    y1 = x1;
    y2 = x2;
  }
  dVar8 = y1;
  dVar6 = dVar5;
  if (dVar7 < dVar5) {
    dVar8 = y2;
    dVar6 = dVar7;
    dVar7 = dVar5;
    y2 = y1;
  }
  if (dVar6 < 0.0) {
    if (dVar7 < 0.0) {
      return;
    }
    dVar5 = -dVar6 / (dVar7 - dVar6);
    dVar8 = dVar8 * (1.0 - dVar5) + dVar5 * y2;
    dVar6 = 0.0;
  }
  dVar5 = (double)(int)ptr->color[(ulong)(dVar12 < dVar11) - 2];
  if (dVar6 <= dVar5) {
    dVar1 = dVar6 + 0.5;
    dVar10 = dVar10 / dVar9;
    dVar8 = ((double)(int)dVar1 - dVar6) * dVar10 + dVar8;
    dVar9 = floor(dVar1);
    uVar3 = (uint)dVar8;
    dVar6 = floor(dVar8);
    if (dVar7 <= dVar5) {
      dVar5 = dVar7;
    }
    uVar2 = (uint)dVar1;
    dVar7 = (dVar9 - dVar1) + 1.0;
    dVar9 = ((dVar6 - dVar8) + 1.0) * dVar7;
    if (dVar11 <= dVar12) {
      CanvasDrawPointInternal(uVar2,uVar3,dVar9,ptr);
      uVar4 = uVar3 + 1;
      uVar3 = uVar2;
    }
    else {
      CanvasDrawPointInternal(uVar3,uVar2,dVar9,ptr);
      uVar4 = uVar2;
      uVar3 = uVar3 + 1;
    }
    CanvasDrawPointInternal(uVar3,uVar4,(dVar8 - dVar6) * dVar7,ptr);
    dVar1 = dVar5 + 0.5;
    dVar9 = ((double)(int)dVar1 - dVar5) * dVar10 + y2;
    dVar7 = floor(dVar1);
    uVar4 = (uint)dVar9;
    dVar5 = floor(dVar9);
    uVar3 = (uint)dVar1;
    dVar6 = ((dVar5 - dVar9) + 1.0) * (dVar1 - dVar7);
    if (dVar11 <= dVar12) {
      CanvasDrawPointInternal(uVar3,uVar4,dVar6,ptr);
      y = uVar4 + 1;
      uVar4 = uVar3;
    }
    else {
      CanvasDrawPointInternal(uVar4,uVar3,dVar6,ptr);
      y = uVar3;
      uVar4 = uVar4 + 1;
    }
    CanvasDrawPointInternal(uVar4,y,(dVar9 - dVar5) * (dVar1 - dVar7),ptr);
    dVar8 = dVar8 + dVar10;
    uVar2 = uVar2 + 1;
    if (dVar11 <= dVar12) {
      if ((int)uVar2 < (int)uVar3) {
        do {
          dVar12 = floor(dVar8);
          CanvasDrawPointInternal(uVar2,(int)dVar8,(dVar12 - dVar8) + 1.0,ptr);
          CanvasDrawPointInternal(uVar2,(int)dVar8 + 1,dVar8 - dVar12,ptr);
          dVar8 = dVar8 + dVar10;
          uVar2 = uVar2 + 1;
        } while (uVar3 != uVar2);
      }
    }
    else if ((int)uVar2 < (int)uVar3) {
      do {
        dVar12 = floor(dVar8);
        CanvasDrawPointInternal((int)dVar8,uVar2,(dVar12 - dVar8) + 1.0,ptr);
        CanvasDrawPointInternal((int)dVar8 + 1,uVar2,dVar8 - dVar12,ptr);
        dVar8 = dVar8 + dVar10;
        uVar2 = uVar2 + 1;
      } while (uVar3 != uVar2);
    }
  }
  return;
}

Assistant:

void CanvasDrawLineAA(double x1, double y1, double x2, double y2, Canvas* ptr)
	{
		if(!ptr)
		{
			nullcThrowError("ERROR: Canvas object is nullptr");
			return;
		}
		double dx = x2 - x1;
		double dy = y2 - y1;
		bool steep = false;
		if(abs(dx) < abs(dy))
		{			
			swap(x1, y1);
			swap(x2, y2);
			swap(dx, dy);
			steep = true;
		}
		if(x2 < x1)
		{
			swap(x1, x2);
			swap(y1, y2);
		}
		if(x1 < 0.0)
		{
			if(x2 < 0.0)
				return;
			double l = -x1 / (x2 - x1);
			x1 = 0.0;
			y1 = y1 * (1.0 - l) + y2 * l;
		}
		if(x1 > (steep ? ptr->height : ptr->width))
			return;
		if(x2 > (steep ? ptr->height : ptr->width))
			x2 = steep ? ptr->height : ptr->width;
		double gradient = dy / dx;

		// handle first endpoint
		int xend = round(x1);
		double yend = y1 + gradient * (xend - x1);
		double xgap = rfpart(x1 + 0.5);
		int xpxl1 = xend;
		int ypxl1 = int(yend);
		if(steep)
		{
			CanvasDrawPointInternal(ypxl1, xpxl1, rfpart(yend) * xgap, ptr);
			CanvasDrawPointInternal(ypxl1 + 1, xpxl1, fpart(yend) * xgap, ptr);
		}else{
			CanvasDrawPointInternal(xpxl1, ypxl1, rfpart(yend) * xgap, ptr);
			CanvasDrawPointInternal(xpxl1, ypxl1 + 1, fpart(yend) * xgap, ptr);
		}
		double intery = yend + gradient; // first y-intersection for the main loop

		// handle second endpoint
		xend = round(x2);
		yend = y2 + gradient * (xend - x2);
		xgap = fpart(x2 + 0.5);
		int xpxl2 = xend ; // this will be used in the main loop
		int ypxl2 = int(yend);
		if(steep)
		{
			CanvasDrawPointInternal(ypxl2, xpxl2, rfpart(yend) * xgap, ptr);
			CanvasDrawPointInternal(ypxl2 + 1, xpxl2, fpart(yend) * xgap, ptr);
		}else{
			CanvasDrawPointInternal(xpxl2, ypxl2, rfpart(yend) * xgap, ptr);
			CanvasDrawPointInternal(xpxl2, ypxl2 + 1, fpart(yend) * xgap, ptr);
		}

		if(steep)
		{
			for(int x = xpxl1 + 1; x < xpxl2; x++)
			{
				CanvasDrawPointInternal(int(intery), x, rfpart(intery), ptr);
				CanvasDrawPointInternal(int(intery) + 1, x, fpart(intery), ptr);
				intery = intery + gradient;
			}
		}else{
			for(int x = xpxl1 + 1; x < xpxl2; x++)
			{
				CanvasDrawPointInternal(x, int(intery), rfpart(intery), ptr);
				CanvasDrawPointInternal(x, int(intery) + 1, fpart(intery), ptr);
				intery = intery + gradient;
			}
		}
	}